

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::invalidateSolverData(Highs *this)

{
  Highs *in_RDI;
  
  invalidateModelStatus(in_RDI);
  invalidateSolution((Highs *)0x483682);
  invalidateBasis((Highs *)0x48368c);
  invalidateRanging((Highs *)0x483696);
  invalidateInfo((Highs *)0x4836a0);
  invalidateEkk((Highs *)0x4836aa);
  invalidateIis((Highs *)0x4836b4);
  return;
}

Assistant:

void Highs::invalidateSolverData() {
  invalidateModelStatus();
  invalidateSolution();
  invalidateBasis();
  invalidateRanging();
  invalidateInfo();
  invalidateEkk();
  invalidateIis();
}